

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsDQJtimes(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *arkode_mem,
                 N_Vector work)

{
  int iVar1;
  int iVar2;
  double dVar3;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_40;
  ARKodeMem local_38;
  
  iVar1 = arkLs_AccessARKODELMem(arkode_mem,"arkLsDQJtimes",&local_38,&local_40);
  if (iVar1 == 0) {
    dVar3 = (double)N_VWrmsNorm(v,local_38->ewt);
    dVar3 = 1.0 / dVar3;
    iVar1 = 3;
    do {
      N_VLinearSum(dVar3,0x3ff0000000000000,v,y,work);
      iVar2 = (*local_40->Jt_f)(t,work,Jv,local_38->user_data);
      local_40->nfeDQ = local_40->nfeDQ + 1;
      if (iVar2 == 0) break;
      if (iVar2 < 0) {
        return -1;
      }
      dVar3 = dVar3 * 0.25;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 1;
    if (iVar2 == 0) {
      N_VLinearSum(1.0 / dVar3,-(1.0 / dVar3),Jv,fy,Jv);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int arkLsDQJtimes(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                  N_Vector fy, void* arkode_mem, N_Vector work)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunrealtype sig, siginv;
  int iter, retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Initialize perturbation to 1/||v|| */
  sig = ONE / N_VWrmsNorm(v, ark_mem->ewt);

  for (iter = 0; iter < MAX_DQITERS; iter++)
  {
    /* Set work = y + sig*v */
    N_VLinearSum(sig, v, ONE, y, work);

    /* Set Jv = f(tn, y+sig*v) */
    retval = arkls_mem->Jt_f(t, work, Jv, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    /* If fi failed recoverably, shrink sig and retry */
    sig *= PT25;
  }

  /* If retval still isn't 0, return with a recoverable failure */
  if (retval > 0) { return (+1); }

  /* Replace Jv by (Jv - fy)/sig */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, fy, Jv);

  return (0);
}